

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int filter(int *lb,int *ub,int col,char c)

{
  int iVar1;
  opcode_t *poVar2;
  char cVar3;
  
  while( true ) {
    iVar1 = *lb;
    if ((opcodes[iVar1].str[col] == c) || (opcodes[iVar1].str[col] == ' ' && c == '\0')) break;
    *lb = iVar1 + 1;
    if (*ub <= iVar1) {
      return 0;
    }
  }
  iVar1 = *ub;
  cVar3 = opcodes[iVar1].str[col];
  if (cVar3 != c) {
    poVar2 = opcodes + iVar1;
    do {
      iVar1 = iVar1 + -1;
      poVar2 = poVar2 + -1;
      if ((c == '\0') && (cVar3 == ' ')) {
        return 1;
      }
      *ub = iVar1;
      cVar3 = poVar2->str[col];
    } while (cVar3 != c);
  }
  return 1;
}

Assistant:

int filter(int *lb, int *ub, int col, char c)
{
    while (opcodes[*lb].str[col] != c)
    {
        if (!c && opcodes[*lb].str[col] == ' ')
            break;

        ++*lb;
        if (*lb > *ub)
            return 0;
    }

    while (opcodes[*ub].str[col] != c)
    {
        if (!c && opcodes[*ub].str[col] == ' ')
            break;

        --*ub;
    }

    return 1;
}